

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result wabt::ReadBinaryObjdump
                 (uint8_t *data,size_t size,ObjdumpOptions *options,ObjdumpState *state)

{
  undefined1 *this;
  undefined1 local_3d0 [8];
  BinaryReaderObjdump reader_2;
  BinaryReaderObjdumpDisassemble reader_1;
  BinaryReaderObjdumpPrepass reader;
  ReadBinaryOptions read_options;
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  bool kReadDebugNames;
  Features features;
  ObjdumpState *state_local;
  ObjdumpOptions *options_local;
  size_t size_local;
  uint8_t *data_local;
  
  this = &read_options.field_0x25;
  Features::Features((Features *)this);
  Features::EnableAll((Features *)this);
  read_options._36_1_ = 1;
  read_options.skip_function_bodies = false;
  read_options.fail_on_custom_section_error = false;
  ReadBinaryOptions::ReadBinaryOptions
            ((ReadBinaryOptions *)&reader.super_BinaryReaderObjdumpBase.err_stream_,(Features *)this
             ,options->log_stream,true,false,false);
  if (options->mode == Prepass) {
    read_options.log_stream._3_1_ = 1;
    anon_unknown_16::BinaryReaderObjdumpPrepass::BinaryReaderObjdumpBase
              ((BinaryReaderObjdumpPrepass *)&reader_1.in_function_body,data,size,options,state);
    data_local._4_4_ =
         ReadBinary(data,size,(BinaryReaderDelegate *)&reader_1.in_function_body,
                    (ReadBinaryOptions *)&reader.super_BinaryReaderObjdumpBase.err_stream_);
    anon_unknown_16::BinaryReaderObjdumpPrepass::~BinaryReaderObjdumpPrepass
              ((BinaryReaderObjdumpPrepass *)&reader_1.in_function_body);
  }
  else if (options->mode == Disassemble) {
    anon_unknown_16::BinaryReaderObjdumpDisassemble::BinaryReaderObjdumpBase
              ((BinaryReaderObjdumpDisassemble *)&reader_2.elem_offset_,data,size,options,state);
    data_local._4_4_ =
         ReadBinary(data,size,(BinaryReaderDelegate *)&reader_2.elem_offset_,
                    (ReadBinaryOptions *)&reader.super_BinaryReaderObjdumpBase.err_stream_);
    anon_unknown_16::BinaryReaderObjdumpDisassemble::~BinaryReaderObjdumpDisassemble
              ((BinaryReaderObjdumpDisassemble *)&reader_2.elem_offset_);
  }
  else {
    read_options.log_stream._3_1_ = 1;
    anon_unknown_16::BinaryReaderObjdump::BinaryReaderObjdump
              ((BinaryReaderObjdump *)local_3d0,data,size,options,state);
    data_local._4_4_ =
         ReadBinary(data,size,(BinaryReaderDelegate *)local_3d0,
                    (ReadBinaryOptions *)&reader.super_BinaryReaderObjdumpBase.err_stream_);
    anon_unknown_16::BinaryReaderObjdump::~BinaryReaderObjdump((BinaryReaderObjdump *)local_3d0);
  }
  return (Result)data_local._4_4_;
}

Assistant:

Result ReadBinaryObjdump(const uint8_t* data,
                         size_t size,
                         ObjdumpOptions* options,
                         ObjdumpState* state) {
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = false;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions read_options(features, options->log_stream, kReadDebugNames,
                                 kStopOnFirstError, kFailOnCustomSectionError);

  switch (options->mode) {
    case ObjdumpMode::Prepass: {
      read_options.skip_function_bodies = true;
      BinaryReaderObjdumpPrepass reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    case ObjdumpMode::Disassemble: {
      BinaryReaderObjdumpDisassemble reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    default: {
      read_options.skip_function_bodies = true;
      BinaryReaderObjdump reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
  }
}